

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

bool __thiscall
SQFunctionProto::Save(SQFunctionProto *this,SQVM *v,SQUserPointer up,SQWRITEFUNC write)

{
  bool bVar1;
  SQLocalVarInfo *o;
  SQLocalVarInfo *lvi;
  SQInteger ndefaultparams;
  SQInteger nfunctions;
  SQInteger ninstructions;
  SQInteger nlineinfos;
  SQInteger nlocalvarinfos;
  SQInteger noutervalues;
  SQInteger nparameters;
  SQInteger nliterals;
  SQInteger i;
  SQWRITEFUNC write_local;
  SQUserPointer up_local;
  SQVM *v_local;
  SQFunctionProto *this_local;
  
  nparameters = this->_nliterals;
  noutervalues = this->_nparameters;
  nlocalvarinfos = this->_noutervalues;
  nlineinfos = this->_nlocalvarinfos;
  ninstructions = this->_nlineinfos;
  nfunctions = this->_ninstructions;
  ndefaultparams = this->_nfunctions;
  lvi = (SQLocalVarInfo *)this->_ndefaultparams;
  i = (SQInteger)write;
  write_local = (SQWRITEFUNC)up;
  up_local = v;
  v_local = (SQVM *)this;
  bVar1 = WriteTag(v,write,up,0x50415254);
  if (bVar1) {
    bVar1 = WriteObject((HSQUIRRELVM)up_local,write_local,(SQWRITEFUNC)i,&this->_sourcename);
    if (bVar1) {
      bVar1 = WriteObject((HSQUIRRELVM)up_local,write_local,(SQWRITEFUNC)i,&this->_name);
      if (bVar1) {
        bVar1 = WriteTag((HSQUIRRELVM)up_local,(SQWRITEFUNC)i,write_local,0x50415254);
        if (bVar1) {
          bVar1 = SafeWrite((HSQUIRRELVM)up_local,(SQWRITEFUNC)i,write_local,&nparameters,8);
          if (bVar1) {
            bVar1 = SafeWrite((HSQUIRRELVM)up_local,(SQWRITEFUNC)i,write_local,&noutervalues,8);
            if (bVar1) {
              bVar1 = SafeWrite((HSQUIRRELVM)up_local,(SQWRITEFUNC)i,write_local,&nlocalvarinfos,8);
              if (bVar1) {
                bVar1 = SafeWrite((HSQUIRRELVM)up_local,(SQWRITEFUNC)i,write_local,&nlineinfos,8);
                if (bVar1) {
                  bVar1 = SafeWrite((HSQUIRRELVM)up_local,(SQWRITEFUNC)i,write_local,&ninstructions,
                                    8);
                  if (bVar1) {
                    bVar1 = SafeWrite((HSQUIRRELVM)up_local,(SQWRITEFUNC)i,write_local,&lvi,8);
                    if (bVar1) {
                      bVar1 = SafeWrite((HSQUIRRELVM)up_local,(SQWRITEFUNC)i,write_local,&nfunctions
                                        ,8);
                      if (bVar1) {
                        bVar1 = SafeWrite((HSQUIRRELVM)up_local,(SQWRITEFUNC)i,write_local,
                                          &ndefaultparams,8);
                        if (bVar1) {
                          bVar1 = WriteTag((HSQUIRRELVM)up_local,(SQWRITEFUNC)i,write_local,
                                           0x50415254);
                          if (bVar1) {
                            for (nliterals = 0; nliterals < nparameters; nliterals = nliterals + 1)
                            {
                              bVar1 = WriteObject((HSQUIRRELVM)up_local,write_local,(SQWRITEFUNC)i,
                                                  this->_literals + nliterals);
                              if (!bVar1) {
                                return false;
                              }
                            }
                            bVar1 = WriteTag((HSQUIRRELVM)up_local,(SQWRITEFUNC)i,write_local,
                                             0x50415254);
                            if (bVar1) {
                              for (nliterals = 0; nliterals < noutervalues;
                                  nliterals = nliterals + 1) {
                                bVar1 = WriteObject((HSQUIRRELVM)up_local,write_local,(SQWRITEFUNC)i
                                                    ,this->_parameters + nliterals);
                                if (!bVar1) {
                                  return false;
                                }
                              }
                              bVar1 = WriteTag((HSQUIRRELVM)up_local,(SQWRITEFUNC)i,write_local,
                                               0x50415254);
                              if (bVar1) {
                                for (nliterals = 0; nliterals < nlocalvarinfos;
                                    nliterals = nliterals + 1) {
                                  bVar1 = SafeWrite((HSQUIRRELVM)up_local,(SQWRITEFUNC)i,write_local
                                                    ,this->_outervalues + nliterals,8);
                                  if (!bVar1) {
                                    return false;
                                  }
                                  bVar1 = WriteObject((HSQUIRRELVM)up_local,write_local,
                                                      (SQWRITEFUNC)i,
                                                      &this->_outervalues[nliterals]._src);
                                  if (!bVar1) {
                                    return false;
                                  }
                                  bVar1 = WriteObject((HSQUIRRELVM)up_local,write_local,
                                                      (SQWRITEFUNC)i,
                                                      &this->_outervalues[nliterals]._name);
                                  if (!bVar1) {
                                    return false;
                                  }
                                }
                                bVar1 = WriteTag((HSQUIRRELVM)up_local,(SQWRITEFUNC)i,write_local,
                                                 0x50415254);
                                if (bVar1) {
                                  for (nliterals = 0; nliterals < nlineinfos;
                                      nliterals = nliterals + 1) {
                                    o = this->_localvarinfos + nliterals;
                                    bVar1 = WriteObject((HSQUIRRELVM)up_local,write_local,
                                                        (SQWRITEFUNC)i,&o->_name);
                                    if (!bVar1) {
                                      return false;
                                    }
                                    bVar1 = SafeWrite((HSQUIRRELVM)up_local,(SQWRITEFUNC)i,
                                                      write_local,&o->_pos,8);
                                    if (!bVar1) {
                                      return false;
                                    }
                                    bVar1 = SafeWrite((HSQUIRRELVM)up_local,(SQWRITEFUNC)i,
                                                      write_local,&o->_start_op,8);
                                    if (!bVar1) {
                                      return false;
                                    }
                                    bVar1 = SafeWrite((HSQUIRRELVM)up_local,(SQWRITEFUNC)i,
                                                      write_local,&o->_end_op,8);
                                    if (!bVar1) {
                                      return false;
                                    }
                                  }
                                  bVar1 = WriteTag((HSQUIRRELVM)up_local,(SQWRITEFUNC)i,write_local,
                                                   0x50415254);
                                  if (bVar1) {
                                    bVar1 = SafeWrite((HSQUIRRELVM)up_local,(SQWRITEFUNC)i,
                                                      write_local,this->_lineinfos,
                                                      ninstructions << 4);
                                    if (bVar1) {
                                      bVar1 = WriteTag((HSQUIRRELVM)up_local,(SQWRITEFUNC)i,
                                                       write_local,0x50415254);
                                      if (bVar1) {
                                        bVar1 = SafeWrite((HSQUIRRELVM)up_local,(SQWRITEFUNC)i,
                                                          write_local,this->_defaultparams,
                                                          (long)lvi << 3);
                                        if (bVar1) {
                                          bVar1 = WriteTag((HSQUIRRELVM)up_local,(SQWRITEFUNC)i,
                                                           write_local,0x50415254);
                                          if (bVar1) {
                                            bVar1 = SafeWrite((HSQUIRRELVM)up_local,(SQWRITEFUNC)i,
                                                              write_local,this->_instructions,
                                                              nfunctions << 3);
                                            if (bVar1) {
                                              bVar1 = WriteTag((HSQUIRRELVM)up_local,(SQWRITEFUNC)i,
                                                               write_local,0x50415254);
                                              if (bVar1) {
                                                for (nliterals = 0; nliterals < ndefaultparams;
                                                    nliterals = nliterals + 1) {
                                                  bVar1 = Save(this->_functions[nliterals].
                                                               super_SQObject._unVal.pFunctionProto,
                                                               (SQVM *)up_local,write_local,
                                                               (SQWRITEFUNC)i);
                                                  if (!bVar1) {
                                                    return false;
                                                  }
                                                }
                                                bVar1 = SafeWrite((HSQUIRRELVM)up_local,
                                                                  (SQWRITEFUNC)i,write_local,
                                                                  &this->_stacksize,8);
                                                if (bVar1) {
                                                  bVar1 = SafeWrite((HSQUIRRELVM)up_local,
                                                                    (SQWRITEFUNC)i,write_local,
                                                                    &this->_bgenerator,1);
                                                  if (bVar1) {
                                                    bVar1 = SafeWrite((HSQUIRRELVM)up_local,
                                                                      (SQWRITEFUNC)i,write_local,
                                                                      &this->_varparams,8);
                                                    if (bVar1) {
                                                      this_local._7_1_ = true;
                                                    }
                                                    else {
                                                      this_local._7_1_ = false;
                                                    }
                                                  }
                                                  else {
                                                    this_local._7_1_ = false;
                                                  }
                                                }
                                                else {
                                                  this_local._7_1_ = false;
                                                }
                                              }
                                              else {
                                                this_local._7_1_ = false;
                                              }
                                            }
                                            else {
                                              this_local._7_1_ = false;
                                            }
                                          }
                                          else {
                                            this_local._7_1_ = false;
                                          }
                                        }
                                        else {
                                          this_local._7_1_ = false;
                                        }
                                      }
                                      else {
                                        this_local._7_1_ = false;
                                      }
                                    }
                                    else {
                                      this_local._7_1_ = false;
                                    }
                                  }
                                  else {
                                    this_local._7_1_ = false;
                                  }
                                }
                                else {
                                  this_local._7_1_ = false;
                                }
                              }
                              else {
                                this_local._7_1_ = false;
                              }
                            }
                            else {
                              this_local._7_1_ = false;
                            }
                          }
                          else {
                            this_local._7_1_ = false;
                          }
                        }
                        else {
                          this_local._7_1_ = false;
                        }
                      }
                      else {
                        this_local._7_1_ = false;
                      }
                    }
                    else {
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SQFunctionProto::Save(SQVM *v,SQUserPointer up,SQWRITEFUNC write)
{
    SQInteger i,nliterals = _nliterals,nparameters = _nparameters;
    SQInteger noutervalues = _noutervalues,nlocalvarinfos = _nlocalvarinfos;
    SQInteger nlineinfos=_nlineinfos,ninstructions = _ninstructions,nfunctions=_nfunctions;
    SQInteger ndefaultparams = _ndefaultparams;
    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(WriteObject(v,up,write,_sourcename));
    _CHECK_IO(WriteObject(v,up,write,_name));
    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeWrite(v,write,up,&nliterals,sizeof(nliterals)));
    _CHECK_IO(SafeWrite(v,write,up,&nparameters,sizeof(nparameters)));
    _CHECK_IO(SafeWrite(v,write,up,&noutervalues,sizeof(noutervalues)));
    _CHECK_IO(SafeWrite(v,write,up,&nlocalvarinfos,sizeof(nlocalvarinfos)));
    _CHECK_IO(SafeWrite(v,write,up,&nlineinfos,sizeof(nlineinfos)));
    _CHECK_IO(SafeWrite(v,write,up,&ndefaultparams,sizeof(ndefaultparams)));
    _CHECK_IO(SafeWrite(v,write,up,&ninstructions,sizeof(ninstructions)));
    _CHECK_IO(SafeWrite(v,write,up,&nfunctions,sizeof(nfunctions)));
    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    for(i=0;i<nliterals;i++){
        _CHECK_IO(WriteObject(v,up,write,_literals[i]));
    }

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    for(i=0;i<nparameters;i++){
        _CHECK_IO(WriteObject(v,up,write,_parameters[i]));
    }

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    for(i=0;i<noutervalues;i++){
        _CHECK_IO(SafeWrite(v,write,up,&_outervalues[i]._type,sizeof(SQUnsignedInteger)));
        _CHECK_IO(WriteObject(v,up,write,_outervalues[i]._src));
        _CHECK_IO(WriteObject(v,up,write,_outervalues[i]._name));
    }

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    for(i=0;i<nlocalvarinfos;i++){
        SQLocalVarInfo &lvi=_localvarinfos[i];
        _CHECK_IO(WriteObject(v,up,write,lvi._name));
        _CHECK_IO(SafeWrite(v,write,up,&lvi._pos,sizeof(SQUnsignedInteger)));
        _CHECK_IO(SafeWrite(v,write,up,&lvi._start_op,sizeof(SQUnsignedInteger)));
        _CHECK_IO(SafeWrite(v,write,up,&lvi._end_op,sizeof(SQUnsignedInteger)));
    }

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeWrite(v,write,up,_lineinfos,sizeof(SQLineInfo)*nlineinfos));

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeWrite(v,write,up,_defaultparams,sizeof(SQInteger)*ndefaultparams));

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeWrite(v,write,up,_instructions,sizeof(SQInstruction)*ninstructions));

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    for(i=0;i<nfunctions;i++){
        _CHECK_IO(_funcproto(_functions[i])->Save(v,up,write));
    }
    _CHECK_IO(SafeWrite(v,write,up,&_stacksize,sizeof(_stacksize)));
    _CHECK_IO(SafeWrite(v,write,up,&_bgenerator,sizeof(_bgenerator)));
    _CHECK_IO(SafeWrite(v,write,up,&_varparams,sizeof(_varparams)));
    return true;
}